

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

void pybind11::detail::
     process_attributes<pybind11::name,_pybind11::scope,_pybind11::sibling,_pybind11::return_value_policy>
     ::precall(function_call *call)

{
  function_call *call_local;
  
  process_attribute_default<pybind11::name>::precall(call);
  process_attribute_default<pybind11::scope>::precall(call);
  process_attribute_default<pybind11::sibling>::precall(call);
  process_attribute_default<pybind11::return_value_policy>::precall(call);
  return;
}

Assistant:

static void precall(function_call &call) {
        PYBIND11_WORKAROUND_INCORRECT_MSVC_C4100(call);
        using expander = int[];
        (void) expander{0,
                        (process_attribute<typename std::decay<Args>::type>::precall(call), 0)...};
    }